

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

shared_ptr<wallet::CWallet>
wallet::TestLoadWallet
          (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           *database,WalletContext *context,uint64_t create_flags)

{
  bilingual_str *in_RCX;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar1;
  shared_ptr<wallet::CWallet> *wallet;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  bilingual_str error;
  bilingual_str *in_stack_fffffffffffffef8;
  bilingual_str *this;
  CWallet *in_stack_ffffffffffffff00;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *this_00;
  string *name;
  WalletContext *context_00;
  allocator<char> *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar2;
  undefined1 local_90 [15];
  undefined1 local_81 [25];
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> local_68 [4];
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bilingual_str::bilingual_str(in_stack_fffffffffffffef8);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffef8);
  uVar2 = 0;
  context_00 = (WalletContext *)local_81;
  name = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  this_00 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)local_90;
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffffef8,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xec4e4c);
  this = (bilingual_str *)(local_81 + 1);
  CWallet::Create((WalletContext *)in_RDI,name,local_68,(uint64_t)this_00,in_RCX,local_48);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             this_00);
  std::__cxx11::string::~string(&this->original);
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  NotifyWalletLoaded(context_00,(shared_ptr<wallet::CWallet> *)name);
  if ((in_RDX->_M_dataplus)._M_p != (pointer)0x0) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this);
    CWallet::postInitProcess(in_stack_ffffffffffffff00);
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(this_00);
  bilingual_str::~bilingual_str(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<wallet::CWallet>)
         sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(std::unique_ptr<WalletDatabase> database, WalletContext& context, uint64_t create_flags)
{
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto wallet = CWallet::Create(context, "", std::move(database), create_flags, error, warnings);
    NotifyWalletLoaded(context, wallet);
    if (context.chain) {
        wallet->postInitProcess();
    }
    return wallet;
}